

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O1

void __thiscall
xray_re::cse_alife_level_changer::cse_alife_level_changer(cse_alife_level_changer *this)

{
  shape_def_vec *psVar1;
  
  cse_abstract::cse_abstract((cse_abstract *)this);
  (this->super_cse_alife_space_restrictor).super_cse_alife_dynamic_object.super_cse_alife_object.
  m_graph_id = 0xffff;
  (this->super_cse_alife_space_restrictor).super_cse_alife_dynamic_object.super_cse_alife_object.
  m_distance = 0.0;
  (this->super_cse_alife_space_restrictor).super_cse_alife_dynamic_object.super_cse_alife_object.
  m_direct_control = false;
  (this->super_cse_alife_space_restrictor).super_cse_alife_dynamic_object.super_cse_alife_object.
  m_node_id = 0xffffffff;
  (this->super_cse_alife_space_restrictor).super_cse_alife_dynamic_object.super_cse_alife_object.
  m_flags = 0xffffffff;
  (this->super_cse_alife_space_restrictor).super_cse_alife_dynamic_object.super_cse_alife_object.
  m_story_id = 0xffffffff;
  (this->super_cse_alife_space_restrictor).super_cse_alife_dynamic_object.super_cse_alife_object.
  m_spawn_story_id = 0xffffffff;
  psVar1 = &(this->super_cse_alife_space_restrictor).super_cse_shape.m_shapes;
  (psVar1->super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (psVar1->super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_cse_alife_space_restrictor).super_cse_shape.m_shapes.
  super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_cse_alife_space_restrictor).m_space_restrictor_type = '\0';
  (this->super_cse_alife_space_restrictor).super_cse_alife_dynamic_object.super_cse_alife_object.
  super_cse_abstract._vptr_cse_abstract = (_func_int **)&PTR__cse_alife_level_changer_002464d8;
  (this->super_cse_alife_space_restrictor).super_cse_shape._vptr_cse_shape =
       (_func_int **)&PTR__cse_alife_level_changer_00246540;
  *(undefined2 *)&(this->super_cse_alife_space_restrictor).field_0x13a = 0xffff;
  *(undefined4 *)&(this->super_cse_alife_space_restrictor).field_0x13c = 0xffffffff;
  (this->m_level_to_change)._M_dataplus._M_p = (pointer)&(this->m_level_to_change).field_2;
  (this->m_level_to_change)._M_string_length = 0;
  (this->m_level_to_change).field_2._M_local_buf[0] = '\0';
  (this->m_level_point_to_change)._M_dataplus._M_p =
       (pointer)&(this->m_level_point_to_change).field_2;
  (this->m_level_point_to_change)._M_string_length = 0;
  (this->m_level_point_to_change).field_2._M_local_buf[0] = '\0';
  this->m_silent_mode = false;
  *(undefined8 *)((long)&(this->m_angles).field_0 + 4) = 0;
  *(undefined1 (*) [16])&this->m_next_position = (undefined1  [16])0x0;
  return;
}

Assistant:

cse_alife_level_changer::cse_alife_level_changer():
	m_next_graph_id(UNDEF16), m_next_node_id(UNDEF32),
	m_silent_mode(false)
{
	m_next_position.set();
	m_angles.set();
}